

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nntree.cc
# Opt level: O0

void test_depth(void)

{
  bool bVar1;
  ostream *poVar2;
  reference pTVar3;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  string local_6c0;
  undefined1 local_6a0 [8];
  iterator i_1;
  undefined1 local_638 [8];
  T i;
  iterator __end1;
  iterator __begin1;
  QPDFNameTreeObjectHelper *__range1;
  undefined1 local_560 [8];
  QPDFNameTreeObjectHelper nh;
  string local_520 [32];
  string local_500;
  QPDFObjectHandle local_4e0;
  allocator<char> local_4c9;
  string local_4c8 [32];
  string local_4a8;
  QPDFObjectHandle local_488;
  allocator<char> local_471;
  string local_470;
  undefined1 local_450 [8];
  QPDFObjectHandle limits;
  string local_438 [32];
  string local_418;
  QPDFObjectHandle local_3f8;
  allocator<char> local_3e1;
  string local_3e0 [32];
  string local_3c0;
  QPDFObjectHandle local_3a0;
  allocator<char> local_389;
  string local_388;
  undefined1 local_368 [8];
  QPDFObjectHandle limits_1;
  QPDFObjectHandle local_348;
  allocator<char> local_331;
  string local_330;
  undefined1 local_310 [8];
  QPDFObjectHandle limits_2;
  QPDFObjectHandle local_2e0;
  QPDFObjectHandle local_2d0;
  undefined1 local_2c0 [8];
  string str;
  int val;
  int i4;
  string last;
  string first;
  string local_250 [32];
  undefined1 local_230 [8];
  QPDFObjectHandle items;
  string local_218 [32];
  undefined1 local_1f8 [8];
  QPDFObjectHandle n3;
  int i3;
  undefined1 local_1c0 [8];
  QPDFObjectHandle k2;
  string local_1a8 [32];
  undefined1 local_188 [8];
  QPDFObjectHandle n2;
  int i2;
  undefined1 local_150 [8];
  QPDFObjectHandle k1;
  string local_138 [32];
  undefined1 local_118 [8];
  QPDFObjectHandle n1;
  int i1;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [24];
  QPDFObjectHandle k0;
  string local_90;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle n0;
  QPDFObjectHandle root;
  undefined1 local_18 [8];
  QPDF q;
  int NITEMS;
  
  q.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl._4_4_ = 3;
  QPDF::QPDF((QPDF *)local_18);
  QPDF::emptyPDF((QPDF *)local_18);
  QPDF::getRoot((QPDF *)&n0.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Kids",&local_69);
  new_node((QPDF *)local_48,(string *)local_18);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"/NT",
             (allocator<char> *)
             ((long)&k0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &n0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_90,(QPDFObjectHandle *)local_48);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&k0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"/NT",&local_d9);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)local_b8,
             (string *)
             &n0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i1,"/Kids",
             (allocator<char> *)
             ((long)&n1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_b8 + 0x10),(string *)local_b8);
  std::__cxx11::string::~string((string *)&i1);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&n1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  for (n1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._0_4_ = 0;
      (int)n1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi < 3;
      n1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = (int)n1.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"/Kids",
               (allocator<char> *)
               ((long)&k1.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    new_node((QPDF *)local_118,(string *)local_18);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&k1.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::appendItem
              ((QPDFObjectHandle *)(local_b8 + 0x10),(QPDFObjectHandle *)local_118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i2,"/Kids",
               (allocator<char> *)
               ((long)&n2.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_150,(string *)local_118);
    std::__cxx11::string::~string((string *)&i2);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&n2.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    for (n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._0_4_ = 0;
        (int)n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi < 3;
        n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ =
             (int)n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a8,"/Kids",
                 (allocator<char> *)
                 ((long)&k2.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      new_node((QPDF *)local_188,(string *)local_18);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&k2.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_150,(QPDFObjectHandle *)local_188);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i3,"/Kids",
                 (allocator<char> *)
                 ((long)&n3.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1c0,(string *)local_188);
      std::__cxx11::string::~string((string *)&i3);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&n3.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      for (n3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._0_4_ = 0;
          (int)n3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi < 3;
          n3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_ =
               (int)n3.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
          ) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_218,"/Names",
                   (allocator<char> *)
                   ((long)&items.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        new_node((QPDF *)local_1f8,(string *)local_18);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&items.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_1c0,(QPDFObjectHandle *)local_1f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_250,"/Names",(allocator<char> *)(first.field_2._M_local_buf + 0xf));
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_230,(string *)local_1f8);
        std::__cxx11::string::~string(local_250);
        std::allocator<char>::~allocator((allocator<char> *)(first.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string((string *)(last.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&val);
        for (str.field_2._12_4_ = 0; (int)str.field_2._12_4_ < 3;
            str.field_2._12_4_ = str.field_2._12_4_ + 1) {
          str.field_2._8_4_ =
               (((int)n1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi *
                 3 + (int)n2.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi) * 3 +
               (int)n3.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) *
               3 + str.field_2._12_4_;
          QUtil::int_to_string_abi_cxx11_
                    ((string *)local_2c0,(QUtil *)(long)(str.field_2._8_4_ * 10),6,
                     str.field_2._8_4_ * 2);
          QPDFObjectHandle::newString(&local_2d0,(string *)local_2c0);
          QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_230,&local_2d0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_2d0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &limits_2.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         "val ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2c0);
          QPDFObjectHandle::newString
                    (&local_2e0,
                     (string *)
                     &limits_2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_230,&local_2e0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_2e0);
          std::__cxx11::string::~string
                    ((string *)
                     &limits_2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          if (str.field_2._12_4_ == 0) {
            std::__cxx11::string::operator=
                      ((string *)(last.field_2._M_local_buf + 8),(string *)local_2c0);
          }
          else if (str.field_2._12_4_ == 2) {
            std::__cxx11::string::operator=((string *)&val,(string *)local_2c0);
          }
          std::__cxx11::string::~string((string *)local_2c0);
        }
        QPDFObjectHandle::newArray();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"/Limits",&local_331);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_1f8,&local_330,(QPDFObjectHandle *)local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator(&local_331);
        QPDFObjectHandle::newString(&local_348,(string *)((long)&last.field_2 + 8));
        QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_310,&local_348);
        QPDFObjectHandle::~QPDFObjectHandle(&local_348);
        QPDFObjectHandle::newString
                  ((QPDFObjectHandle *)
                   &limits_1.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (string *)&val);
        QPDFObjectHandle::appendItem
                  ((QPDFObjectHandle *)local_310,
                   (QPDFObjectHandle *)
                   &limits_1.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &limits_1.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_310);
        std::__cxx11::string::~string((string *)&val);
        std::__cxx11::string::~string((string *)(last.field_2._M_local_buf + 8));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_230);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1f8);
      }
      QPDFObjectHandle::newArray();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"/Limits",&local_389);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_188,&local_388,(QPDFObjectHandle *)local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator(&local_389);
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_3c0,(int)local_1c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3e0,"/Limits",&local_3e1);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_3c0.field_2,&local_3c0);
      QPDFObjectHandle::getArrayItem(&local_3a0,(int)&local_3c0 + 0x10);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_368,&local_3a0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3a0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_3c0.field_2);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_3c0);
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_418,(int)local_1c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_438,"/Limits",
                 (allocator<char> *)
                 ((long)&limits.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_418.field_2,&local_418);
      QPDFObjectHandle::getArrayItem(&local_3f8,(int)&local_418 + 0x10);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_368,&local_3f8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3f8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_418.field_2);
      std::__cxx11::string::~string(local_438);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&limits.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_418);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_368);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_188);
    }
    QPDFObjectHandle::newArray();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"/Limits",&local_471);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_118,&local_470,(QPDFObjectHandle *)local_450);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_4a8,(int)local_150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4c8,"/Limits",&local_4c9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_4a8.field_2,&local_4a8);
    QPDFObjectHandle::getArrayItem(&local_488,(int)&local_4a8 + 0x10);
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_450,&local_488);
    QPDFObjectHandle::~QPDFObjectHandle(&local_488);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_4a8.field_2);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_4a8);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_500,(int)local_150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_520,"/Limits",
               (allocator<char> *)
               ((long)&nh.m.
                       super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_500.field_2,&local_500);
    QPDFObjectHandle::getArrayItem(&local_4e0,(int)&local_500 + 0x10);
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_450,&local_4e0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_4e0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_500.field_2);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&nh.m.
                       super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_500);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_450);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_150);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
  }
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1,(QPDFObjectHandle *)local_48);
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
            ((QPDFNameTreeObjectHelper *)local_560,(QPDFObjectHandle *)&__range1,(QPDF *)local_18,
             true);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  poVar2 = std::operator<<((ostream *)&std::cout,"--- forward ---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QPDFNameTreeObjectHelper::begin
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFNameTreeObjectHelper *)local_560);
  QPDFNameTreeObjectHelper::end
            ((iterator *)
             &i.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFNameTreeObjectHelper *)local_560);
  while (bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                           ((iterator *)
                            &__end1.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)
                            &i.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        , bVar1) {
    pTVar3 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_
                       ((iterator *)
                        &__end1.ivalue.second.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)local_638,pTVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_638);
    poVar2 = std::operator<<(poVar2," -> ");
    QPDFObjectHandle::unparse_abi_cxx11_
              ((string *)
               &i_1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (QPDFObjectHandle *)((long)&i.first.field_2 + 8));
    poVar2 = std::operator<<(poVar2,(string *)
                                    &i_1.ivalue.second.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &i_1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
             *)local_638);
    QPDFNameTreeObjectHelper::iterator::operator++
              ((iterator *)
               &__end1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &i.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"--- backward ---");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  QPDFNameTreeObjectHelper::last((iterator *)local_6a0,(QPDFNameTreeObjectHelper *)local_560);
  while (bVar1 = QPDFNameTreeObjectHelper::iterator::valid((iterator *)local_6a0), bVar1) {
    pTVar3 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_((iterator *)local_6a0);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)pTVar3);
    poVar2 = std::operator<<(poVar2," -> ");
    pTVar3 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_((iterator *)local_6a0);
    QPDFObjectHandle::unparse_abi_cxx11_(&local_6c0,&pTVar3->second);
    poVar2 = std::operator<<(poVar2,(string *)&local_6c0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_6c0);
    QPDFNameTreeObjectHelper::iterator::operator--((iterator *)local_6a0);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_6a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"000300",&local_6e1);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_6e0,false);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"000305",&local_709);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_708,true);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"000305",&local_731);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_730,false);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"00000",&local_759);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_758,false);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"00000",&local_781);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_780,true);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"000800",&local_7a9);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_7a8,false);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,"000805",&local_7d1);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_7d0,false);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"000805",&local_7f9);
  check_find((QPDFNameTreeObjectHelper *)local_560,&local_7f8,true);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_560);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_b8 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &n0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDF::~QPDF((QPDF *)local_18);
  return;
}

Assistant:

void
test_depth()
{
    int constexpr NITEMS = 3;
    QPDF q;
    q.emptyPDF();
    auto root = q.getRoot();
    auto n0 = new_node(q, "/Kids");
    root.replaceKey("/NT", n0);
    auto k0 = root.getKey("/NT").getKey("/Kids");
    for (int i1 = 0; i1 < NITEMS; ++i1) {
        auto n1 = new_node(q, "/Kids");
        k0.appendItem(n1);
        auto k1 = n1.getKey("/Kids");
        for (int i2 = 0; i2 < NITEMS; ++i2) {
            auto n2 = new_node(q, "/Kids");
            k1.appendItem(n2);
            auto k2 = n2.getKey("/Kids");
            for (int i3 = 0; i3 < NITEMS; ++i3) {
                auto n3 = new_node(q, "/Names");
                k2.appendItem(n3);
                auto items = n3.getKey("/Names");
                std::string first;
                std::string last;
                for (int i4 = 0; i4 < NITEMS; ++i4) {
                    int val = (((((i1 * NITEMS) + i2) * NITEMS) + i3) * NITEMS) + i4;
                    std::string str = QUtil::int_to_string(10 * val, 6);
                    items.appendItem(QPDFObjectHandle::newString(str));
                    items.appendItem(QPDFObjectHandle::newString("val " + str));
                    if (i4 == 0) {
                        first = str;
                    } else if (i4 == NITEMS - 1) {
                        last = str;
                    }
                }
                auto limits = QPDFObjectHandle::newArray();
                n3.replaceKey("/Limits", limits);
                limits.appendItem(QPDFObjectHandle::newString(first));
                limits.appendItem(QPDFObjectHandle::newString(last));
            }
            auto limits = QPDFObjectHandle::newArray();
            n2.replaceKey("/Limits", limits);
            limits.appendItem(k2.getArrayItem(0).getKey("/Limits").getArrayItem(0));
            limits.appendItem(k2.getArrayItem(NITEMS - 1).getKey("/Limits").getArrayItem(1));
        }
        auto limits = QPDFObjectHandle::newArray();
        n1.replaceKey("/Limits", limits);
        limits.appendItem(k1.getArrayItem(0).getKey("/Limits").getArrayItem(0));
        limits.appendItem(k1.getArrayItem(NITEMS - 1).getKey("/Limits").getArrayItem(1));
    }

    QPDFNameTreeObjectHelper nh(n0, q);
    std::cout << "--- forward ---" << std::endl;
    for (auto i: nh) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- backward ---" << std::endl;
    for (auto i = nh.last(); i.valid(); --i) {
        std::cout << (*i).first << " -> " << (*i).second.unparse() << std::endl;
    }

    // Find
    check_find(nh, "000300", false);
    check_find(nh, "000305", true);
    check_find(nh, "000305", false);
    check_find(nh, "00000", false);
    check_find(nh, "00000", true);
    check_find(nh, "000800", false);
    check_find(nh, "000805", false);
    check_find(nh, "000805", true);
}